

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O0

void brotli::ZopfliIterate
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               size_t max_backward_limit,ZopfliCostModel *model,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *num_matches,
               vector<brotli::BackwardMatch,_std::allocator<brotli::BackwardMatch>_> *matches,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  double dVar1;
  uint32_t uVar2;
  double dVar3;
  double dVar4;
  pointer puVar5;
  undefined8 uVar6;
  ZopfliNode *pZVar7;
  BackwardMatch BVar8;
  reference pvVar9;
  ulong uVar10;
  unsigned_long *puVar11;
  size_t limit;
  size_t sVar12;
  size_t sVar13;
  int *dist_cache_00;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  const_reference pvVar17;
  const_reference pvVar18;
  ulong uVar19;
  reference pvVar20;
  ZopfliNode *pZVar21;
  BackwardMatch BVar22;
  bool bVar23;
  size_t local_330;
  undefined1 local_268 [8];
  Command cmd;
  size_t dist_code_1;
  uint8_t *puStack_240;
  bool is_dictionary;
  ulong local_238;
  size_t max_distance_1;
  size_t len_code_1;
  size_t distance;
  size_t insert_length;
  size_t copy_length;
  ZopfliNode *next;
  size_t i_2;
  size_t pos;
  size_t i_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  size_t len_2;
  size_t index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> backwards;
  double cost_1;
  double cmd_cost_1;
  size_t inslen_1;
  size_t len_code;
  size_t max_len;
  size_t dist_code;
  bool is_dictionary_match;
  size_t dist;
  BackwardMatch match;
  size_t j_1;
  size_t len;
  double cost;
  double cmd_cost;
  size_t inslen;
  size_t l;
  size_t len_1;
  size_t prev_ix;
  size_t backward;
  size_t idx;
  size_t j;
  size_t best_len;
  int *dist_cache2;
  double start_costdiff;
  size_t start;
  size_t k;
  size_t min_len;
  size_t max_length;
  size_t max_distance;
  size_t cur_ix_masked;
  size_t cur_ix;
  size_t i;
  size_t cur_match_pos;
  double min_cost_cmd;
  StartPosQueue queue;
  allocator<brotli::ZopfliNode> local_61;
  undefined1 local_60 [8];
  vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> nodes;
  Command *orig_commands;
  ZopfliCostModel *model_local;
  size_t max_backward_limit_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  
  nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)commands;
  model_local = (ZopfliCostModel *)max_backward_limit;
  max_backward_limit_local = ringbuffer_mask;
  ringbuffer_mask_local = (size_t)ringbuffer;
  ringbuffer_local = (uint8_t *)position;
  position_local = num_bytes;
  std::allocator<brotli::ZopfliNode>::allocator(&local_61);
  std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::vector
            ((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)local_60,
             num_bytes + 1,&local_61);
  std::allocator<brotli::ZopfliNode>::~allocator(&local_61);
  pvVar9 = std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::operator[]
                     ((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)local_60,0)
  ;
  pvVar9->length = 0;
  pvVar9 = std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::operator[]
                     ((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)local_60,0)
  ;
  pvVar9->cost = 0.0;
  pvVar9 = std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::operator[]
                     ((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)local_60,0)
  ;
  uVar6 = *(undefined8 *)(dist_cache + 2);
  *(undefined8 *)pvVar9->distance_cache = *(undefined8 *)dist_cache;
  *(undefined8 *)(pvVar9->distance_cache + 2) = uVar6;
  StartPosQueue::StartPosQueue((StartPosQueue *)&min_cost_cmd,3);
  cur_match_pos = (size_t)ZopfliCostModel::GetMinCostCmd(model);
  i = 0;
  for (cur_ix = 0; cur_ix + 3 < position_local; cur_ix = cur_ix + 1) {
    cur_ix_masked = (size_t)(ringbuffer_local + cur_ix);
    uVar10 = cur_ix_masked & max_backward_limit_local;
    puVar11 = std::min<unsigned_long>(&cur_ix_masked,(unsigned_long *)&model_local);
    sVar12 = cur_ix;
    uVar19 = *puVar11;
    limit = position_local - cur_ix;
    pvVar9 = std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::operator[]
                       ((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)local_60,
                        cur_ix);
    dVar1 = pvVar9->cost;
    dVar3 = ZopfliCostModel::GetLiteralCosts(model,0,cur_ix);
    StartPosQueue::Push((StartPosQueue *)&min_cost_cmd,sVar12,dVar1 - dVar3);
    sVar12 = ComputeMinimumCopyLength
                       ((StartPosQueue *)&min_cost_cmd,
                        (vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)local_60,
                        model,cur_ix,(double)cur_match_pos);
    start = 0;
    while( true ) {
      bVar23 = false;
      if (start < 5) {
        sVar13 = StartPosQueue::size((StartPosQueue *)&min_cost_cmd);
        bVar23 = start < sVar13;
      }
      if (!bVar23) break;
      sVar13 = StartPosQueue::GetStartPos((StartPosQueue *)&min_cost_cmd,start);
      pvVar9 = std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::operator[]
                         ((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)
                          local_60,sVar13);
      dVar1 = pvVar9->cost;
      dVar3 = ZopfliCostModel::GetLiteralCosts(model,0,sVar13);
      dVar1 = dVar1 - dVar3;
      pvVar9 = std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::operator[]
                         ((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)
                          local_60,sVar13);
      dist_cache_00 = pvVar9->distance_cache;
      j = sVar12 - 1;
      for (idx = 0; idx < 0x10; idx = idx + 1) {
        uVar14 = (ulong)(dist_cache_00[*(uint *)(kDistanceCacheIndex + idx * 4)] +
                        *(int *)(kDistanceCacheOffset + idx * 4));
        if ((((cur_ix_masked - uVar14 < cur_ix_masked) && (uVar14 <= uVar19)) &&
            (uVar15 = max_backward_limit_local & cur_ix_masked - uVar14,
            uVar10 + j <= max_backward_limit_local)) &&
           ((uVar15 + j <= max_backward_limit_local &&
            (*(char *)(ringbuffer_mask_local + uVar10 + j) ==
             *(char *)(ringbuffer_mask_local + uVar15 + j))))) {
          sVar16 = FindMatchLengthWithLimit
                             ((uint8_t *)(ringbuffer_mask_local + uVar15),
                              (uint8_t *)(ringbuffer_mask_local + uVar10),limit);
          while (inslen = j + 1, inslen <= sVar16) {
            dVar3 = ZopfliCostModel::GetCommandCost(model,idx,inslen,cur_ix - sVar13);
            dVar4 = ZopfliCostModel::GetLiteralCosts(model,0,cur_ix);
            dVar4 = dVar1 + dVar3 + dVar4;
            pvVar9 = std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::
                     operator[]((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)
                                local_60,cur_ix + inslen);
            if (dVar4 < pvVar9->cost) {
              pvVar9 = std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::
                       operator[]((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *
                                  )local_60,0);
              UpdateZopfliNode(pvVar9,cur_ix,sVar13,inslen,inslen,uVar14,idx,uVar19,dist_cache_00,
                               dVar4);
            }
            j = inslen;
          }
        }
      }
      if (start < 2) {
        match.distance = 0;
        match.length_and_code = 0;
        j_1 = sVar12;
        for (; BVar8 = match,
            pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (num_matches,cur_ix), BVar22.length_and_code = 0,
            BVar22.distance = *pvVar17, (ulong)BVar8 < (ulong)BVar22;
            match = (BackwardMatch)((long)match + 1)) {
          pvVar18 = std::vector<brotli::BackwardMatch,_std::allocator<brotli::BackwardMatch>_>::
                    operator[](matches,i + (long)match);
          dist = *(size_t *)pvVar18;
          uVar14 = dist & 0xffffffff;
          sVar16 = BackwardMatch::length((BackwardMatch *)&dist);
          if ((j_1 < sVar16) && ((uVar19 < uVar14 || (0x145 < sVar16)))) {
            j_1 = sVar16;
          }
          for (; j_1 <= sVar16; j_1 = j_1 + 1) {
            if (uVar19 < uVar14) {
              local_330 = BackwardMatch::length_code((BackwardMatch *)&dist);
            }
            else {
              local_330 = j_1;
            }
            dVar3 = ZopfliCostModel::GetCommandCost(model,uVar14 + 0xf,local_330,cur_ix - sVar13);
            dVar4 = ZopfliCostModel::GetLiteralCosts(model,0,cur_ix);
            puVar5 = (pointer)(dVar1 + dVar3 + dVar4);
            backwards.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = puVar5;
            pvVar9 = std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::
                     operator[]((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)
                                local_60,cur_ix + j_1);
            if ((double)puVar5 < pvVar9->cost) {
              pvVar9 = std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::
                       operator[]((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *
                                  )local_60,0);
              UpdateZopfliNode(pvVar9,cur_ix,sVar13,j_1,local_330,uVar14,uVar14 + 0xf,uVar19,
                               dist_cache_00,
                               (double)backwards.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
          }
        }
      }
      start = start + 1;
    }
    pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (num_matches,cur_ix);
    i = *pvVar17 + i;
    pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (num_matches,cur_ix);
    if (*pvVar17 == 1) {
      pvVar18 = std::vector<brotli::BackwardMatch,_std::allocator<brotli::BackwardMatch>_>::
                operator[](matches,i - 1);
      sVar12 = BackwardMatch::length(pvVar18);
      if (0x145 < sVar12) {
        pvVar18 = std::vector<brotli::BackwardMatch,_std::allocator<brotli::BackwardMatch>_>::
                  operator[](matches,i - 1);
        sVar12 = BackwardMatch::length(pvVar18);
        cur_ix = (sVar12 - 1) + cur_ix;
        StartPosQueue::Clear((StartPosQueue *)&min_cost_cmd);
      }
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index);
  len_2 = position_local;
  while( true ) {
    pvVar9 = std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::operator[]
                       ((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)local_60,
                        len_2);
    if ((pvVar9->cost != INFINITY) || (NAN(pvVar9->cost))) break;
    len_2 = len_2 - 1;
  }
  for (; len_2 != 0; len_2 = len_2 - uVar19) {
    pvVar9 = std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::operator[]
                       ((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)local_60,
                        len_2);
    uVar2 = pvVar9->length;
    pvVar9 = std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::operator[]
                       ((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)local_60,
                        len_2);
    path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = uVar2 + pvVar9->insert_length;
    uVar19 = (ulong)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index,
               (value_type_conflict *)
               ((long)&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1);
  for (pos = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index); pos != 0;
      pos = pos - 1) {
    pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index,pos - 1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,pvVar20);
  }
  i_2 = 0;
  for (next = (ZopfliNode *)0x0; pZVar7 = next,
      pZVar21 = (ZopfliNode *)
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1),
      sVar12 = i_2, pZVar7 < pZVar21; next = (ZopfliNode *)((long)&next->length + 1)) {
    pvVar20 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1,(size_type)next
                        );
    copy_length = (size_t)std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::
                          operator[]((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                      *)local_60,sVar12 + *pvVar20);
    insert_length = (size_t)((reference)copy_length)->length;
    distance = (size_t)((reference)copy_length)->insert_length;
    i_2 = distance + i_2;
    if (next == (ZopfliNode *)0x0) {
      distance = *last_insert_len + distance;
      *last_insert_len = 0;
    }
    len_code_1 = (size_t)((reference)copy_length)->distance;
    max_distance_1 = (size_t)((reference)copy_length)->length_code;
    puStack_240 = ringbuffer_local + i_2;
    puVar11 = std::min<unsigned_long>
                        ((unsigned_long *)&stack0xfffffffffffffdc0,(unsigned_long *)&model_local);
    local_238 = *puVar11;
    bVar23 = len_code_1 <= local_238;
    cmd._16_8_ = ZEXT48(*(uint *)(copy_length + 8));
    Command::Command((Command *)local_268,distance,insert_length,max_distance_1,cmd._16_8_);
    commands->insert_len_ = local_268._0_4_;
    commands->copy_len_ = local_268._4_4_;
    commands->cmd_extra_ = cmd._0_8_;
    commands->dist_extra_ = (undefined4)cmd.cmd_extra_;
    commands->cmd_prefix_ = cmd.cmd_extra_._4_2_;
    commands->dist_prefix_ = cmd.cmd_extra_._6_2_;
    if ((bVar23) && (cmd._16_8_ != 0)) {
      dist_cache[3] = dist_cache[2];
      dist_cache[2] = dist_cache[1];
      dist_cache[1] = *dist_cache;
      *dist_cache = (int)len_code_1;
    }
    *num_literals = distance + *num_literals;
    distance = 0;
    i_2 = insert_length + i_2;
    commands = commands + 1;
  }
  *last_insert_len = (position_local - i_2) + *last_insert_len;
  *num_commands =
       ((long)commands -
       (long)nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage) / 0x18 + *num_commands;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i_1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&index);
  StartPosQueue::~StartPosQueue((StartPosQueue *)&min_cost_cmd);
  std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::~vector
            ((vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> *)local_60);
  return;
}

Assistant:

void ZopfliIterate(size_t num_bytes,
                   size_t position,
                   const uint8_t* ringbuffer,
                   size_t ringbuffer_mask,
                   const size_t max_backward_limit,
                   const ZopfliCostModel& model,
                   const std::vector<uint32_t>& num_matches,
                   const std::vector<BackwardMatch>& matches,
                   int* dist_cache,
                   size_t* last_insert_len,
                   Command* commands,
                   size_t* num_commands,
                   size_t* num_literals) {
  const Command * const orig_commands = commands;

  std::vector<ZopfliNode> nodes(num_bytes + 1);
  nodes[0].length = 0;
  nodes[0].cost = 0;
  memcpy(nodes[0].distance_cache, dist_cache, 4 * sizeof(dist_cache[0]));

  StartPosQueue queue(3);
  const double min_cost_cmd = model.GetMinCostCmd();

  size_t cur_match_pos = 0;
  for (size_t i = 0; i + 3 < num_bytes; i++) {
    size_t cur_ix = position + i;
    size_t cur_ix_masked = cur_ix & ringbuffer_mask;
    size_t max_distance = std::min(cur_ix, max_backward_limit);
    size_t max_length = num_bytes - i;

    queue.Push(i, nodes[i].cost - model.GetLiteralCosts(0, i));

    const size_t min_len = ComputeMinimumCopyLength(queue, nodes, model,
                                                    i, min_cost_cmd);

    // Go over the command starting positions in order of increasing cost
    // difference.
    for (size_t k = 0; k < 5 && k < queue.size(); ++k) {
      const size_t start = queue.GetStartPos(k);
      const double start_costdiff =
          nodes[start].cost - model.GetLiteralCosts(0, start);
      const int* dist_cache2 = &nodes[start].distance_cache[0];

      // Look for last distance matches using the distance cache from this
      // starting position.
      size_t best_len = min_len - 1;
      for (size_t j = 0; j < kNumDistanceShortCodes; ++j) {
        const size_t idx = kDistanceCacheIndex[j];
        const size_t backward =
            static_cast<size_t>(dist_cache2[idx] + kDistanceCacheOffset[j]);
        size_t prev_ix = cur_ix - backward;
        if (prev_ix >= cur_ix) {
          continue;
        }
        if (PREDICT_FALSE(backward > max_distance)) {
          continue;
        }
        prev_ix &= ringbuffer_mask;

        if (cur_ix_masked + best_len > ringbuffer_mask ||
            prev_ix + best_len > ringbuffer_mask ||
            ringbuffer[cur_ix_masked + best_len] !=
            ringbuffer[prev_ix + best_len]) {
          continue;
        }
        const size_t len =
            FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                     &ringbuffer[cur_ix_masked],
                                     max_length);
        for (size_t l = best_len + 1; l <= len; ++l) {
          const size_t inslen = i - start;
          double cmd_cost = model.GetCommandCost(j, l, inslen);
          double cost = start_costdiff + cmd_cost + model.GetLiteralCosts(0, i);
          if (cost < nodes[i + l].cost) {
            UpdateZopfliNode(&nodes[0], i, start, l, l, backward, j,
                             max_distance, dist_cache2, cost);
          }
          best_len = l;
        }
      }

      // At higher iterations look only for new last distance matches, since
      // looking only for new command start positions with the same distances
      // does not help much.
      if (k >= 2) continue;

      // Loop through all possible copy lengths at this position.
      size_t len = min_len;
      for (size_t j = 0; j < num_matches[i]; ++j) {
        BackwardMatch match = matches[cur_match_pos + j];
        size_t dist = match.distance;
        bool is_dictionary_match = dist > max_distance;
        // We already tried all possible last distance matches, so we can use
        // normal distance code here.
        size_t dist_code = dist + 15;
        // Try all copy lengths up until the maximum copy length corresponding
        // to this distance. If the distance refers to the static dictionary, or
        // the maximum length is long enough, try only one maximum length.
        size_t max_len = match.length();
        if (len < max_len && (is_dictionary_match || max_len > kMaxZopfliLen)) {
          len = max_len;
        }
        for (; len <= max_len; ++len) {
          size_t len_code = is_dictionary_match ? match.length_code() : len;
          const size_t inslen = i - start;
          double cmd_cost = model.GetCommandCost(dist_code, len_code, inslen);
          double cost = start_costdiff + cmd_cost + model.GetLiteralCosts(0, i);
          if (cost < nodes[i + len].cost) {
            UpdateZopfliNode(&nodes[0], i, start, len, len_code, dist,
                             dist_code, max_distance, dist_cache2, cost);
          }
        }
      }
    }

    cur_match_pos += num_matches[i];

    // The zopflification can be too slow in case of very long lengths, so in
    // such case skip it all, it does not cost a lot of compression ratio.
    if (num_matches[i] == 1 &&
        matches[cur_match_pos - 1].length() > kMaxZopfliLen) {
      i += matches[cur_match_pos - 1].length() - 1;
      queue.Clear();
    }
  }

  std::vector<uint32_t> backwards;
  size_t index = num_bytes;
  while (nodes[index].cost == kInfinity) --index;
  while (index != 0) {
    size_t len = nodes[index].length + nodes[index].insert_length;
    backwards.push_back(static_cast<uint32_t>(len));
    index -= len;
  }

  std::vector<uint32_t> path;
  for (size_t i = backwards.size(); i > 0; i--) {
    path.push_back(backwards[i - 1]);
  }

  size_t pos = 0;
  for (size_t i = 0; i < path.size(); i++) {
    const ZopfliNode& next = nodes[pos + path[i]];
    size_t copy_length = next.length;
    size_t insert_length = next.insert_length;
    pos += insert_length;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    size_t distance = next.distance;
    size_t len_code = next.length_code;
    size_t max_distance = std::min(position + pos, max_backward_limit);
    bool is_dictionary = (distance > max_distance);
    size_t dist_code = next.distance_code;

    Command cmd(insert_length, copy_length, len_code, dist_code);
    *commands++ = cmd;

    if (!is_dictionary && dist_code > 0) {
      dist_cache[3] = dist_cache[2];
      dist_cache[2] = dist_cache[1];
      dist_cache[1] = dist_cache[0];
      dist_cache[0] = static_cast<int>(distance);
    }

    *num_literals += insert_length;
    insert_length = 0;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
  *num_commands += static_cast<size_t>(commands - orig_commands);
}